

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*> * __thiscall
testing::internal::MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>::operator=
          (MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*> *this,
          MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*> *other)

{
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }